

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void BackOneToken(Lexer *lexer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  lVar5 = (long)lexer->previousTrackerSpot;
  lexer->previousTrackerSpot = lexer->previousTrackerSpot + -1;
  if (lVar5 < 1) {
    lexer->previousTrackerSpot = lexer->totalTrackers + -1;
  }
  (lexer->tracker).col = lexer->previousTrackers[lVar5].col;
  iVar1 = lexer->previousTrackers[lVar5].tokenEnd;
  iVar2 = lexer->previousTrackers[lVar5].currentTokenPosition;
  iVar3 = lexer->previousTrackers[lVar5].row;
  (lexer->tracker).tokenStart = lexer->previousTrackers[lVar5].tokenStart;
  (lexer->tracker).tokenEnd = iVar1;
  (lexer->tracker).currentTokenPosition = iVar2;
  (lexer->tracker).row = iVar3;
  pcVar4 = GetTokenString(lexer);
  if (lexer->currentTokenString != (char *)0x0) {
    Free(lexer->currentTokenString);
  }
  lexer->currentTokenString = pcVar4;
  return;
}

Assistant:

void BackOneToken(Lexer* lexer){

	LexerTracker* previous = &lexer->previousTrackers[lexer->previousTrackerSpot];

	lexer->previousTrackerSpot--;
	if (lexer->previousTrackerSpot < 0) {
		lexer->previousTrackerSpot = lexer->totalTrackers - 1;
	}
	
	lexer->tracker.col = previous->col;
	lexer->tracker.currentTokenPosition = previous->currentTokenPosition;
	lexer->tracker.row = previous->row;
	lexer->tracker.tokenEnd = previous->tokenEnd;
	lexer->tracker.tokenStart = previous->tokenStart;

	char* token = GetTokenString(lexer);

	if (lexer->currentTokenString != NULL) {
		Free(lexer->currentTokenString);
	}

	lexer->currentTokenString = token;
}